

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O1

void __thiscall
DListBase<Memory::ArenaAllocator,_RealCount>::RemoveElement<Memory::HeapAllocator>
          (DListBase<Memory::ArenaAllocator,_RealCount> *this,HeapAllocator *allocator,
          ArenaAllocator *element)

{
  code *pcVar1;
  bool bVar2;
  DListNode<Memory::ArenaAllocator> *pDVar3;
  undefined4 *puVar4;
  size_t *buffer;
  
  buffer = &element[-1].super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
            freeListSize;
  pDVar3 = (DListNode<Memory::ArenaAllocator> *)this;
  do {
    pDVar3 = (pDVar3->super_DListNodeBase<Memory::ArenaAllocator>).next.node;
    if (pDVar3 == (DListNode<Memory::ArenaAllocator> *)this) break;
  } while (pDVar3 != (DListNode<Memory::ArenaAllocator> *)buffer);
  if (pDVar3 == (DListNode<Memory::ArenaAllocator> *)this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x175,"(HasNode(node))","HasNode(node)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  *(size_t *)
   element[-1].super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList =
       *buffer;
  *(void **)(*buffer + 8) =
       element[-1].super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList
  ;
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            (&element->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>);
  Memory::HeapAllocator::Free(allocator,buffer,0x90);
  (this->super_RealCount).count = (this->super_RealCount).count - 1;
  return;
}

Assistant:

void RemoveElement(TAllocator * allocator, TData * element)
    {
        Node * node = CONTAINING_RECORD(element, Node, data);
#if DBG_DUMP
        Assert(HasNode(node));
#endif
        DListBase::RemoveNode(node);
        AllocatorDelete(TAllocator, allocator, node);

        this->DecrementCount();

    }